

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O2

void fwd_txfm2d_c(int16_t *input,int32_t *output,int stride,TXFM_2D_FLIP_CFG *cfg,int32_t *buf,
                 int bd)

{
  int8_t iVar1;
  int8_t iVar2;
  TXFM_TYPE txfm_type;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  TxfmFunc p_Var7;
  short *psVar8;
  int32_t *piVar9;
  int32_t *piVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int32_t *piVar16;
  int16_t *piVar17;
  ulong uVar18;
  ulong uVar19;
  int8_t stage_range_row [12];
  int8_t stage_range_col [12];
  int32_t row_buffer [64];
  
  uVar3 = tx_size_wide[cfg->tx_size];
  lVar14 = (long)(int)uVar3;
  uVar4 = tx_size_high[cfg->tx_size];
  iVar6 = 0;
  if (uVar3 == uVar4) goto LAB_0033e226;
  if ((int)uVar4 < (int)uVar3) {
    if (uVar4 * 2 == uVar3) {
      iVar6 = 1;
      goto LAB_0033e226;
    }
    if (uVar4 * 4 == uVar3) {
      iVar6 = 2;
      goto LAB_0033e226;
    }
  }
  else {
    if (uVar3 * 2 == uVar4) {
      iVar6 = -1;
      goto LAB_0033e226;
    }
    if (uVar3 * 4 == uVar4) {
      iVar6 = -2;
      goto LAB_0033e226;
    }
  }
  iVar6 = 0;
LAB_0033e226:
  pcVar5 = cfg->shift;
  av1_gen_fwd_stage_range(stage_range_col,stage_range_row,cfg,bd);
  iVar1 = cfg->cos_bit_col;
  iVar2 = cfg->cos_bit_row;
  p_Var7 = fwd_txfm_type_to_func(cfg->txfm_type_col);
  uVar12 = 0;
  txfm_type = cfg->txfm_type_row;
  piVar10 = output + (int)uVar4;
  uVar18 = 0;
  if (0 < (int)uVar4) {
    uVar18 = (ulong)uVar4;
  }
  uVar19 = 0;
  if (0 < (int)uVar3) {
    uVar19 = (ulong)uVar3;
  }
  piVar16 = buf;
  piVar17 = input;
  uVar15 = uVar3;
  for (; uVar15 = uVar15 - 1, uVar12 != uVar19; uVar12 = uVar12 + 1) {
    if (cfg->ud_flip == 0) {
      psVar8 = piVar17;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        output[uVar13] = (int)*psVar8;
        psVar8 = psVar8 + stride;
      }
    }
    else {
      iVar11 = (uVar4 - 1) * stride;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        output[uVar13] = (int)input[uVar12 + (long)iVar11];
        iVar11 = iVar11 - stride;
      }
    }
    (*av1_round_shift_array)(output,uVar4,-(int)*pcVar5);
    (*p_Var7)(output,piVar10,iVar1,stage_range_col);
    (*av1_round_shift_array)(piVar10,uVar4,-(int)pcVar5[1]);
    if (cfg->lr_flip == 0) {
      piVar9 = piVar16;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        *piVar9 = piVar10[uVar13];
        piVar9 = piVar9 + lVar14;
      }
    }
    else {
      piVar9 = buf + (int)uVar15;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        *piVar9 = piVar10[uVar13];
        piVar9 = piVar9 + lVar14;
      }
    }
    piVar17 = piVar17 + 1;
    piVar16 = piVar16 + 1;
  }
  p_Var7 = fwd_txfm_type_to_func(txfm_type);
  iVar11 = -iVar6;
  if (0 < iVar6) {
    iVar11 = iVar6;
  }
  for (uVar12 = 0; uVar12 != uVar18; uVar12 = uVar12 + 1) {
    (*p_Var7)(buf + uVar12 * lVar14,row_buffer,iVar2,stage_range_row);
    (*av1_round_shift_array)(row_buffer,uVar3,-(int)pcVar5[2]);
    if (iVar11 == 1) {
      for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
        row_buffer[uVar13] = (int32_t)((long)row_buffer[uVar13] * 0x16a1 + 0x800U >> 0xc);
      }
    }
    piVar10 = output;
    for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
      *piVar10 = row_buffer[uVar13];
      piVar10 = piVar10 + (int)uVar4;
    }
    output = output + 1;
  }
  return;
}

Assistant:

static inline void fwd_txfm2d_c(const int16_t *input, int32_t *output,
                                const int stride, const TXFM_2D_FLIP_CFG *cfg,
                                int32_t *buf, int bd) {
  int c, r;
  // Note when assigning txfm_size_col, we use the txfm_size from the
  // row configuration and vice versa. This is intentionally done to
  // accurately perform rectangular transforms. When the transform is
  // rectangular, the number of columns will be the same as the
  // txfm_size stored in the row cfg struct. It will make no difference
  // for square transforms.
  const int txfm_size_col = tx_size_wide[cfg->tx_size];
  const int txfm_size_row = tx_size_high[cfg->tx_size];
  // Take the shift from the larger dimension in the rectangular case.
  const int8_t *shift = cfg->shift;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  int8_t stage_range_col[MAX_TXFM_STAGE_NUM];
  int8_t stage_range_row[MAX_TXFM_STAGE_NUM];
  assert(cfg->stage_num_col <= MAX_TXFM_STAGE_NUM);
  assert(cfg->stage_num_row <= MAX_TXFM_STAGE_NUM);
  av1_gen_fwd_stage_range(stage_range_col, stage_range_row, cfg, bd);

  const int8_t cos_bit_col = cfg->cos_bit_col;
  const int8_t cos_bit_row = cfg->cos_bit_row;
  const TxfmFunc txfm_func_col = fwd_txfm_type_to_func(cfg->txfm_type_col);
  const TxfmFunc txfm_func_row = fwd_txfm_type_to_func(cfg->txfm_type_row);

  // use output buffer as temp buffer
  int32_t *temp_in = output;
  int32_t *temp_out = output + txfm_size_row;

  // Columns
  for (c = 0; c < txfm_size_col; ++c) {
    if (cfg->ud_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r) temp_in[r] = input[r * stride + c];
    } else {
      for (r = 0; r < txfm_size_row; ++r)
        // flip upside down
        temp_in[r] = input[(txfm_size_row - r - 1) * stride + c];
    }
    av1_round_shift_array(temp_in, txfm_size_row, -shift[0]);
    txfm_func_col(temp_in, temp_out, cos_bit_col, stage_range_col);
    av1_round_shift_array(temp_out, txfm_size_row, -shift[1]);
    if (cfg->lr_flip == 0) {
      for (r = 0; r < txfm_size_row; ++r)
        buf[r * txfm_size_col + c] = temp_out[r];
    } else {
      for (r = 0; r < txfm_size_row; ++r)
        // flip from left to right
        buf[r * txfm_size_col + (txfm_size_col - c - 1)] = temp_out[r];
    }
  }

  DECLARE_ALIGNED(16, int32_t, row_buffer[MAX_TX_SIZE]);

  // Rows
  for (r = 0; r < txfm_size_row; ++r) {
    txfm_func_row(buf + r * txfm_size_col, row_buffer, cos_bit_row,
                  stage_range_row);
    av1_round_shift_array(row_buffer, txfm_size_col, -shift[2]);
    if (abs(rect_type) == 1) {
      // Multiply everything by Sqrt2 if the transform is rectangular and the
      // size difference is a factor of 2.
      for (c = 0; c < txfm_size_col; ++c) {
        row_buffer[c] =
            round_shift((int64_t)row_buffer[c] * NewSqrt2, NewSqrt2Bits);
      }
    }
    for (c = 0; c < txfm_size_col; ++c) {
      output[c * txfm_size_row + r] = row_buffer[c];
    }
  }
}